

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O2

vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
* __thiscall
deqp::gles2::Performance::anon_unknown_1::FunctionCase::generateProgramData
          (vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
           *__return_storage_ptr__,FunctionCase *this)

{
  DataType *pDVar1;
  CaseType CVar2;
  char __rhs;
  int iVar3;
  int iVar4;
  DataType DVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  ostream *poVar9;
  int iVar10;
  long lVar11;
  int paramNdx_1;
  int iVar12;
  ulong uVar13;
  ostringstream *poVar14;
  int i;
  uint uVar15;
  undefined1 *puVar16;
  char *pcVar17;
  int inputNdx_2;
  string *psVar18;
  int inputNdx;
  bool bVar19;
  bool bVar20;
  ulong local_600;
  string incExpr;
  int local_5c8;
  allocator<char> local_5c1;
  char *local_5c0;
  string incName;
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  undefined1 local_560 [8];
  float local_558;
  float local_554;
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  *local_540;
  int local_534;
  Vec4 local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  undefined1 local_518 [8];
  undefined8 local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  string swizzle;
  undefined1 local_498 [8];
  float local_490;
  float local_48c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string returnPrecisionMaybe;
  char *paramTypeNames [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string paramPrecisionsMaybe [3];
  ostringstream vtx;
  ostringstream frag;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [22];
  ProgramContext local_a8;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_520 = &this->m_func;
  local_540 = __return_storage_ptr__;
  for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
    CVar2 = (this->super_OperatorPerformanceCase).m_caseType;
    pcVar7 = glu::getPrecisionName(this->m_precision);
    local_5c0 = glu::getDataTypeName(this->m_returnType);
    if (this->m_returnType - TYPE_BOOL < 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&returnPrecisionMaybe,"",(allocator<char> *)&vtx);
    }
    else {
      _frag = (pointer)local_210;
      local_210[0]._M_local_buf[0] = '\0';
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                     pcVar7);
      std::operator+(&returnPrecisionMaybe,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx," ");
      std::__cxx11::string::~string((string *)&vtx);
      std::__cxx11::string::~string((string *)&frag);
    }
    DVar5 = this->m_returnType;
    lVar11 = 0x10;
    do {
      puVar16 = (undefined1 *)((long)&paramPrecisionsMaybe[0]._M_dataplus._M_p + lVar11);
      *(undefined1 **)((long)paramPrecisionsMaybe + lVar11 + -0x10) = puVar16;
      *(undefined8 *)((long)paramPrecisionsMaybe + lVar11 + -8) = 0;
      *puVar16 = 0;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x70);
    bVar19 = 8 < DVar5 - TYPE_DOUBLE_MAT2;
    bVar20 = 8 < DVar5 - TYPE_FLOAT_MAT2;
    uVar13 = 0;
    psVar18 = paramPrecisionsMaybe;
    pcVar17 = (char *)0x0;
    local_600 = 0;
    while (uVar13 != 3) {
      pcVar8 = glu::getDataTypeName(this->m_paramTypes[uVar13]);
      paramTypeNames[uVar13] = pcVar8;
      uVar15 = this->m_paramTypes[uVar13] - TYPE_BOOL;
      if (uVar15 < 4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&vtx,"",&local_5c1);
      }
      else {
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        local_478._M_string_length = 0;
        local_478.field_2._M_local_buf[0] = '\0';
        std::operator+(&local_418,&local_478,pcVar7);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                       &local_418," ");
      }
      std::__cxx11::string::operator=((string *)psVar18,(string *)&vtx);
      std::__cxx11::string::~string((string *)&vtx);
      if (3 < uVar15) {
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_478);
      }
      pDVar1 = this->m_paramTypes + uVar13;
      if (pcVar17 == (char *)0x0) {
        pcVar17 = (char *)0x0;
        if (this->m_precision == PRECISION_LOWP) {
          pcVar17 = "mediump";
        }
        if (3 < *pDVar1 - TYPE_INT) {
          pcVar17 = (char *)0x0;
        }
      }
      uVar13 = uVar13 + 1;
      if (*pDVar1 != TYPE_INVALID) {
        local_600 = uVar13;
      }
      local_600 = local_600 & 0xffffffff;
      psVar18 = psVar18 + 1;
    }
    pcVar8 = pcVar7;
    if (pcVar17 != (char *)0x0) {
      pcVar8 = pcVar17;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
    poVar14 = (ostringstream *)&frag;
    if (CVar2 == CASETYPE_VERTEX) {
      poVar14 = (ostringstream *)&vtx;
    }
    std::operator<<((ostream *)&vtx,"attribute highp vec4 a_position;\n");
    local_534 = (int)local_600 + 3;
    iVar12 = 0;
    iVar10 = 0;
    if (0 < local_534) {
      iVar10 = local_534;
    }
    for (; iVar10 != iVar12; iVar12 = iVar12 + 1) {
      poVar9 = std::operator<<((ostream *)&vtx,"attribute ");
      poVar9 = std::operator<<(poVar9,pcVar8);
      poVar9 = std::operator<<(poVar9," vec4 a_in");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
      std::operator<<(poVar9,";\n");
    }
    if (CVar2 == CASETYPE_VERTEX) {
      std::operator<<((ostream *)&vtx,"varying mediump vec4 v_color;\n");
      std::operator<<((ostream *)&frag,"varying mediump vec4 v_color;\n");
    }
    else {
      for (iVar12 = 0; iVar10 != iVar12; iVar12 = iVar12 + 1) {
        poVar9 = std::operator<<((ostream *)&vtx,"varying ");
        poVar9 = std::operator<<(poVar9,pcVar8);
        poVar9 = std::operator<<(poVar9," vec4 v_in");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
        std::operator<<(poVar9,";\n");
        poVar9 = std::operator<<((ostream *)&frag,"varying ");
        poVar9 = std::operator<<(poVar9,pcVar8);
        poVar9 = std::operator<<(poVar9," vec4 v_in");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
        std::operator<<(poVar9,";\n");
      }
    }
    std::operator<<((ostream *)poVar14,"uniform mediump int u_numLoopIterations;\n");
    if (CVar2 == CASETYPE_VERTEX) {
      std::operator<<((ostream *)&vtx,"uniform mediump float u_zero;\n");
    }
    if ((int)local_600 < 1) {
      local_600 = 0;
    }
    psVar18 = paramPrecisionsMaybe;
    for (uVar13 = 0; local_600 != uVar13; uVar13 = uVar13 + 1) {
      poVar9 = std::operator<<((ostream *)poVar14,"uniform ");
      poVar9 = std::operator<<(poVar9,(string *)psVar18);
      poVar9 = std::operator<<(poVar9,paramTypeNames[uVar13]);
      poVar9 = std::operator<<(poVar9," u_inc");
      poVar9 = std::operator<<(poVar9,(char)uVar13 + 'A');
      std::operator<<(poVar9,";\n");
      psVar18 = psVar18 + 1;
    }
    std::operator<<((ostream *)&vtx,"\n");
    std::operator<<((ostream *)&vtx,"void main()\n");
    std::operator<<((ostream *)&vtx,"{\n");
    if (CVar2 != CASETYPE_VERTEX) {
      std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
    }
    std::operator<<((ostream *)&frag,"\n");
    std::operator<<((ostream *)&frag,"void main()\n");
    std::operator<<((ostream *)&frag,"{\n");
    pcVar17 = "v_";
    if (CVar2 == CASETYPE_VERTEX) {
      pcVar17 = "a_";
    }
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      for (uVar13 = 0; iVar12 = (int)lVar11, uVar13 != local_600; uVar13 = uVar13 + 1) {
        DVar5 = this->m_paramTypes[uVar13];
        poVar9 = std::operator<<((ostream *)poVar14,"\t");
        poVar9 = std::operator<<(poVar9,(string *)(paramPrecisionsMaybe + uVar13));
        pcVar8 = paramTypeNames[uVar13];
        poVar9 = std::operator<<(poVar9,pcVar8);
        poVar9 = std::operator<<(poVar9," in");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
        poVar9 = std::operator<<(poVar9,(char)uVar13 + 'a');
        std::operator<<(poVar9," = ");
        if (DVar5 != TYPE_FLOAT_VEC4) {
          poVar9 = std::operator<<((ostream *)poVar14,pcVar8);
          std::operator<<(poVar9,"(");
        }
        if (DVar5 - TYPE_FLOAT_MAT2 < 9 || DVar5 - TYPE_DOUBLE_MAT2 < 9) {
          iVar3 = glu::getDataTypeMatrixNumRows(DVar5);
          iVar4 = glu::getDataTypeMatrixNumColumns(DVar5);
          if (iVar3 < 4) {
            incExpr._M_dataplus._M_p = (pointer)&incExpr.field_2;
            incExpr._M_string_length = 0;
            incExpr.field_2._M_local_buf[0] = '\0';
            std::operator+(&incName,&incExpr,".");
            std::operator+(&swizzle,&incName,
                           _ZZNK4deqp5gles211Performance12_GLOBAL__N_112FunctionCase25generateSingleProgramDataENS3_9ProgramIDEE8swizzles_rel
                           + *(int *)(
                                     _ZZNK4deqp5gles211Performance12_GLOBAL__N_112FunctionCase25generateSingleProgramDataENS3_9ProgramIDEE8swizzles_rel
                                     + (long)(iVar3 + -1) * 4));
            std::__cxx11::string::~string((string *)&incName);
            std::__cxx11::string::~string((string *)&incExpr);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&swizzle,"",(allocator<char> *)&incName);
          }
          iVar3 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar3;
          }
          for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
            pcVar8 = ", ";
            if (iVar3 == 0) {
              pcVar8 = "";
            }
            poVar9 = std::operator<<((ostream *)poVar14,pcVar8);
            poVar9 = std::operator<<(poVar9,pcVar17);
            poVar9 = std::operator<<(poVar9,"in");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12 + (int)uVar13);
            std::operator<<(poVar9,(string *)&swizzle);
          }
          std::__cxx11::string::~string((string *)&swizzle);
        }
        else {
          poVar9 = std::operator<<((ostream *)poVar14,pcVar17);
          poVar9 = std::operator<<(poVar9,"in");
          std::ostream::operator<<(poVar9,iVar12 + (int)uVar13);
          if (uVar13 == (uint)this->m_modifyParamNdx) {
            std::operator<<((ostream *)poVar14," + 2.0");
          }
        }
        if (DVar5 != TYPE_FLOAT_VEC4) {
          std::operator<<((ostream *)poVar14,")");
        }
        std::operator<<((ostream *)poVar14,";\n");
      }
      poVar9 = std::operator<<((ostream *)poVar14,"\t");
      poVar9 = std::operator<<(poVar9,(string *)&returnPrecisionMaybe);
      poVar9 = std::operator<<(poVar9,local_5c0);
      poVar9 = std::operator<<(poVar9," res");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
      poVar9 = std::operator<<(poVar9," = ");
      poVar9 = std::operator<<(poVar9,local_5c0);
      std::operator<<(poVar9,"(0);\n");
    }
    std::operator<<((ostream *)poVar14,"\tfor (int i = 0; i < u_numLoopIterations; i++)\n");
    std::operator<<((ostream *)poVar14,"\t{\n");
    for (local_560._0_4_ = 0.0; (int)local_560._0_4_ < 4; local_560._0_4_ = local_560._0_4_ + 1) {
      if (0 < (int)local_560._0_4_) {
        std::operator<<((ostream *)poVar14,"\n");
      }
      std::operator<<((ostream *)poVar14,"\t\t{\n");
      for (uVar13 = 0; local_600 != uVar13; uVar13 = uVar13 + 1) {
        de::toString<int>(&incExpr,(int *)local_560);
        std::operator+(&incName,"in",&incExpr);
        std::operator+(&swizzle,&incName,(char)uVar13 + 'a');
        std::__cxx11::string::~string((string *)&incName);
        std::__cxx11::string::~string((string *)&incExpr);
        attributes.
        super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&attributes.
                       super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        attributes.
        super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        attributes.
        super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)attributes.
                              super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        std::operator+(&incExpr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&attributes,"u_inc");
        std::operator+(&incName,&incExpr,(char)uVar13 + 'A');
        std::__cxx11::string::~string((string *)&incExpr);
        std::__cxx11::string::~string((string *)&attributes);
        incrementExpr(&incExpr,&incName,this->m_paramTypes[uVar13],this->m_useNearlyConstantInputs);
        poVar9 = std::operator<<((ostream *)poVar14,"\t\t\t");
        poVar9 = std::operator<<(poVar9,(string *)&swizzle);
        poVar9 = std::operator<<(poVar9," = ");
        sumExpr((string *)&attributes,&swizzle,&incExpr,this->m_paramTypes[uVar13]);
        poVar9 = std::operator<<(poVar9,(string *)&attributes);
        std::operator<<(poVar9,";\n");
        std::__cxx11::string::~string((string *)&attributes);
        std::__cxx11::string::~string((string *)&incExpr);
        std::__cxx11::string::~string((string *)&incName);
        std::__cxx11::string::~string((string *)&swizzle);
      }
      poVar9 = std::operator<<((ostream *)poVar14,"\t\t\t");
      poVar9 = std::operator<<(poVar9,(string *)&returnPrecisionMaybe);
      poVar9 = std::operator<<(poVar9,local_5c0);
      poVar9 = std::operator<<(poVar9," eval");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_560._0_4_);
      std::operator<<(poVar9," = ");
      if (iVar6 == 0) {
        poVar9 = std::operator<<((ostream *)poVar14,(string *)local_520);
        std::operator<<(poVar9,"(");
        for (iVar12 = 0; (int)local_600 != iVar12; iVar12 = iVar12 + 1) {
          if (iVar12 != 0) {
            std::operator<<((ostream *)poVar14,", ");
          }
          poVar9 = std::operator<<((ostream *)poVar14,"in");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_560._0_4_);
          std::operator<<(poVar9,(char)iVar12 + 'a');
        }
        pcVar17 = ")";
        poVar9 = (ostream *)poVar14;
      }
      else {
        poVar9 = std::operator<<((ostream *)poVar14,local_5c0);
        pcVar17 = "(1)";
      }
      std::operator<<(poVar9,pcVar17);
      std::operator<<((ostream *)poVar14,";\n");
      de::toString<int>(&incName,(int *)local_560);
      std::operator+(&swizzle,"res",&incName);
      std::__cxx11::string::~string((string *)&incName);
      de::toString<int>(&incExpr,(int *)local_560);
      std::operator+(&incName,"eval",&incExpr);
      std::__cxx11::string::~string((string *)&incExpr);
      incrementExpr(&incExpr,&incName,this->m_returnType,this->m_useNearlyConstantInputs);
      poVar9 = std::operator<<((ostream *)poVar14,"\t\t\tres");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_560._0_4_);
      poVar9 = std::operator<<(poVar9," = ");
      sumExpr((string *)&attributes,&swizzle,&incExpr,this->m_returnType);
      poVar9 = std::operator<<(poVar9,(string *)&attributes);
      std::operator<<(poVar9,";\n");
      std::__cxx11::string::~string((string *)&attributes);
      std::__cxx11::string::~string((string *)&incExpr);
      std::__cxx11::string::~string((string *)&incName);
      std::__cxx11::string::~string((string *)&swizzle);
      std::operator<<((ostream *)poVar14,"\t\t}\n");
    }
    std::operator<<((ostream *)poVar14,"\t}\n");
    std::operator<<((ostream *)poVar14,"\n");
    for (uVar13 = 0; uVar13 != local_600; uVar13 = uVar13 + 1) {
      poVar9 = std::operator<<((ostream *)poVar14,"\t");
      poVar9 = std::operator<<(poVar9,(string *)(paramPrecisionsMaybe + uVar13));
      poVar9 = std::operator<<(poVar9,paramTypeNames[uVar13]);
      poVar9 = std::operator<<(poVar9," sumIn");
      poVar9 = std::operator<<(poVar9,(char)uVar13 + 'A');
      std::operator<<(poVar9," = ");
      incExpr._M_dataplus._M_p = (pointer)&incExpr.field_2;
      incExpr._M_string_length = 0;
      incExpr.field_2._M_local_buf[0] = '\0';
      std::operator+(&incName,&incExpr,"in0");
      __rhs = (char)uVar13 + 'a';
      std::operator+(&swizzle,&incName,__rhs);
      std::__cxx11::string::~string((string *)&incName);
      std::__cxx11::string::~string((string *)&incExpr);
      for (local_530.m_data[0] = 1.4013e-45; (int)local_530.m_data[0] < 4;
          local_530.m_data[0] = (float)((int)local_530.m_data[0] + 1)) {
        local_518 = (undefined1  [8])&local_508;
        local_510 = 0;
        local_508._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_560,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_518,"in");
        de::toString<int>((string *)local_498,(int *)&local_530);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &attributes,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_560,(string *)local_498);
        std::operator+(&incExpr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&attributes,__rhs);
        sumExpr(&incName,&swizzle,&incExpr,this->m_paramTypes[uVar13]);
        std::__cxx11::string::operator=((string *)&swizzle,(string *)&incName);
        std::__cxx11::string::~string((string *)&incName);
        std::__cxx11::string::~string((string *)&incExpr);
        std::__cxx11::string::~string((string *)&attributes);
        std::__cxx11::string::~string((string *)local_498);
        std::__cxx11::string::~string((string *)local_560);
        std::__cxx11::string::~string((string *)local_518);
      }
      std::operator<<((ostream *)poVar14,(string *)&swizzle);
      std::__cxx11::string::~string((string *)&swizzle);
      std::operator<<((ostream *)poVar14,";\n");
    }
    poVar9 = std::operator<<((ostream *)poVar14,"\t");
    poVar9 = std::operator<<(poVar9,(string *)&returnPrecisionMaybe);
    poVar9 = std::operator<<(poVar9,local_5c0);
    std::operator<<(poVar9," sumRes = ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&swizzle,"res0",(allocator<char> *)&incName);
    for (local_560._0_4_ = 1.4013e-45; (int)local_560._0_4_ < 4;
        local_560._0_4_ = local_560._0_4_ + 1) {
      de::toString<int>((string *)&attributes,(int *)local_560);
      std::operator+(&incExpr,"res",(string *)&attributes);
      sumExpr(&incName,&swizzle,&incExpr,this->m_returnType);
      std::__cxx11::string::operator=((string *)&swizzle,(string *)&incName);
      std::__cxx11::string::~string((string *)&incName);
      std::__cxx11::string::~string((string *)&incExpr);
      std::__cxx11::string::~string((string *)&attributes);
    }
    std::operator<<((ostream *)poVar14,(string *)&swizzle);
    std::__cxx11::string::~string((string *)&swizzle);
    std::operator<<((ostream *)poVar14,";\n");
    DVar5 = this->m_returnType;
    if (DVar5 - TYPE_FLOAT_MAT2 < 9 || DVar5 - TYPE_DOUBLE_MAT2 < 9) {
      poVar9 = std::operator<<((ostream *)poVar14,"\t");
      poVar9 = std::operator<<(poVar9,pcVar7);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,local_5c0);
      std::operator<<(poVar9," finalRes = ");
      for (iVar12 = 0; (int)local_600 != iVar12; iVar12 = iVar12 + 1) {
        poVar9 = std::operator<<((ostream *)poVar14,"sumIn");
        poVar9 = std::operator<<(poVar9,(char)iVar12 + 'A');
        std::operator<<(poVar9," + ");
      }
      std::operator<<((ostream *)poVar14,"sumRes;\n");
    }
    else {
      iVar12 = glu::getDataTypeScalarSize(DVar5);
      for (uVar13 = 0; local_600 != uVar13; uVar13 = uVar13 + 1) {
        iVar4 = glu::getDataTypeScalarSize(this->m_paramTypes[uVar13]);
        if (iVar12 <= iVar4) {
          iVar12 = iVar4;
        }
      }
      DVar5 = TYPE_FLOAT;
      if (iVar12 != 1) {
        DVar5 = glu::getDataTypeFloatVec(iVar12);
      }
      pcVar17 = glu::getDataTypeName(DVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&swizzle,pcVar17,(allocator<char> *)&incName);
      poVar9 = std::operator<<((ostream *)poVar14,"\t");
      poVar9 = std::operator<<(poVar9,pcVar7);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,(string *)&swizzle);
      std::operator<<(poVar9," finalRes = ");
      for (iVar12 = 0; (int)local_600 != iVar12; iVar12 = iVar12 + 1) {
        poVar9 = std::operator<<((ostream *)poVar14,(string *)&swizzle);
        poVar9 = std::operator<<(poVar9,"(sumIn");
        poVar9 = std::operator<<(poVar9,(char)iVar12 + 'A');
        std::operator<<(poVar9,") + ");
      }
      poVar9 = std::operator<<((ostream *)poVar14,(string *)&swizzle);
      std::operator<<(poVar9,"(sumRes);\n");
      std::__cxx11::string::~string((string *)&swizzle);
    }
    std::operator<<((ostream *)poVar14,"\tmediump vec4 color = ");
    if (DVar5 == TYPE_FLOAT_VEC4) {
      std::operator<<((ostream *)poVar14,"finalRes");
    }
    else {
      if (bVar20 && bVar19) {
        iVar12 = glu::getDataTypeScalarSize(DVar5);
      }
      else {
        iVar12 = glu::getDataTypeMatrixNumRows(DVar5);
      }
      std::operator<<((ostream *)poVar14,"vec4(");
      if (bVar20 && bVar19) {
        std::operator<<((ostream *)poVar14,"finalRes");
      }
      else {
        for (iVar4 = 0; iVar3 = glu::getDataTypeMatrixNumColumns(DVar5), iVar4 < iVar3;
            iVar4 = iVar4 + 1) {
          if (iVar4 != 0) {
            std::operator<<((ostream *)poVar14," + ");
          }
          poVar9 = std::operator<<((ostream *)poVar14,"finalRes[");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4);
          std::operator<<(poVar9,"]");
        }
      }
      for (; iVar12 < 4; iVar12 = iVar12 + 1) {
        poVar9 = std::operator<<((ostream *)poVar14,", ");
        pcVar7 = "0.0";
        if (iVar12 == 3) {
          pcVar7 = "1.0";
        }
        std::operator<<(poVar9,pcVar7);
      }
      std::operator<<((ostream *)poVar14,")");
    }
    std::operator<<((ostream *)poVar14,";\n");
    poVar9 = std::operator<<((ostream *)poVar14,"\t");
    pcVar7 = "gl_FragColor";
    if (CVar2 == CASETYPE_VERTEX) {
      pcVar7 = "v_color";
    }
    poVar9 = std::operator<<(poVar9,pcVar7);
    std::operator<<(poVar9," = color;\n");
    if (CVar2 == CASETYPE_VERTEX) {
      std::operator<<((ostream *)&vtx,"\tgl_Position = a_position + u_zero*color;\n");
      std::operator<<((ostream *)&frag,"\tgl_FragColor = v_color;\n");
    }
    else {
      for (iVar12 = 0; iVar10 != iVar12; iVar12 = iVar12 + 1) {
        poVar9 = std::operator<<((ostream *)&vtx,"\tv_in");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
        poVar9 = std::operator<<(poVar9," = a_in");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar12);
        std::operator<<(poVar9,";\n");
      }
    }
    std::operator<<((ostream *)&vtx,"}\n");
    std::operator<<((ostream *)&frag,"}\n");
    attributes.
    super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    attributes.
    super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    attributes.
    super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (local_5c8 = 0; local_5c8 < local_534; local_5c8 = local_5c8 + 1) {
      de::toString<int>(&incExpr,&local_5c8);
      std::operator+(&incName,"a_in",&incExpr);
      local_560._0_4_ = (this->m_attribute).m_data[local_5c8 % 4];
      local_560._4_4_ = (this->m_attribute).m_data[(local_5c8 + 1) % 4];
      local_558 = (this->m_attribute).m_data[(local_5c8 + 2) % 4];
      local_554 = (this->m_attribute).m_data[(local_5c8 + 3) % 4];
      local_518._4_4_ = local_558;
      local_518._0_4_ = local_560._4_4_;
      local_510 = CONCAT44(local_560._0_4_,local_554);
      local_530.m_data[0] = local_554;
      local_530.m_data[1] = (float)local_560._0_4_;
      local_530.m_data[2] = (float)local_560._4_4_;
      local_530.m_data[3] = local_558;
      local_498._0_4_ = local_558;
      local_498._4_4_ = local_554;
      local_490 = (float)local_560._0_4_;
      local_48c = (float)local_560._4_4_;
      OperatorPerformanceCase::AttribSpec::AttribSpec
                ((AttribSpec *)&swizzle,incName._M_dataplus._M_p,(Vec4 *)local_560,(Vec4 *)local_518
                 ,(Vec4 *)local_498,&local_530);
      std::
      vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
      ::push_back(&attributes,(AttribSpec *)&swizzle);
      std::__cxx11::string::~string((string *)&swizzle);
      std::__cxx11::string::~string((string *)&incName);
      std::__cxx11::string::~string((string *)&incExpr);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&swizzle,"This is the program ",(allocator<char> *)&incName);
    std::__cxx11::string::append((char *)&swizzle);
    std::operator+(&incExpr," \'",local_520);
    std::operator+(&incName,&incExpr,
                   "\' function calls.\nNote: workload size for this program means the number of loop iterations."
                  );
    std::__cxx11::string::append((string *)&swizzle);
    std::__cxx11::string::~string((string *)&incName);
    std::__cxx11::string::~string((string *)&incExpr);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    OperatorPerformanceCase::ProgramContext::ProgramContext
              (&local_a8,&incName,&incExpr,&attributes,&swizzle);
    std::__cxx11::string::~string((string *)&incExpr);
    std::__cxx11::string::~string((string *)&incName);
    std::__cxx11::string::~string((string *)&swizzle);
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ::~vector(&attributes);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
    lVar11 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)((long)&paramPrecisionsMaybe[0]._M_dataplus._M_p + lVar11));
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != -0x20);
    std::__cxx11::string::~string((string *)&returnPrecisionMaybe);
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
    ::push_back(local_540,&local_a8);
    OperatorPerformanceCase::ProgramContext::~ProgramContext(&local_a8);
  }
  return local_540;
}

Assistant:

vector<FunctionCase::ProgramContext> FunctionCase::generateProgramData (void) const
{
	vector<ProgramContext> progData;
	for (int i = 0; i < PROGRAM_LAST; i++)
		progData.push_back(generateSingleProgramData((ProgramID)i));
	return progData;
}